

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O3

int sint1i_(int *n,double *wsave,int *lensav,int *ier)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  double dVar7;
  int np1;
  int lnsv;
  int ier1;
  int local_5c;
  double local_58;
  ulong local_50;
  double *local_48;
  double local_40;
  int local_38;
  int local_34;
  
  *ier = 0;
  iVar2 = *lensav;
  iVar3 = *n;
  dVar7 = log((double)iVar3);
  iVar5 = 2;
  if ((int)(dVar7 / 0.6931471805599453) + iVar3 / 2 + iVar3 + 4 <= iVar2) {
    uVar4 = *n;
    if ((int)uVar4 < 2) {
      return 0;
    }
    local_48 = wsave + -1;
    local_50 = (ulong)(uVar4 >> 1);
    local_5c = uVar4 + 1;
    local_58 = (double)local_5c;
    local_40 = 3.141592653589793 / local_58;
    uVar6 = 0;
    do {
      uVar1 = uVar6 + 1;
      dVar7 = sin((double)(int)uVar1 * local_40);
      wsave[uVar6] = dVar7 + dVar7;
      uVar6 = uVar1;
    } while (uVar4 >> 1 != uVar1);
    dVar7 = log(local_58);
    local_38 = (int)(dVar7 / 0.6931471805599453) + uVar4 + 5;
    rfft1i_(&local_5c,local_48 + local_50 + 1,&local_38,&local_34);
    iVar5 = 0x14;
    if (local_34 == 0) {
      return 0;
    }
  }
  *ier = iVar5;
  return 0;
}

Assistant:

int sint1i_(int *n, fft_real_t *wsave, int *lensav,
	int *ier)
{
    /* System generated locals */
    int i__1;

    /* Builtin functions */

    /* Local variables */
     int k;
     fft_real_t dt, pi;
     int np1, ns2, ier1, lnsv;
    extern /* Subroutine */ int rfft1i_(int *, fft_real_t *, int *, int
	    *), xerfft_(char *, int *, ftnlen);


    /* Parameter adjustments */
    --wsave;

    /* Function Body */
    *ier = 0;

    if (*lensav < *n / 2 + *n + (int) (log((fft_real_t) (*n)) / log(2.0)) + 4) {
	*ier = 2;
	//xerfft_("SINT1I", &c__3, (ftnlen)6);
	goto L300;
    }

    pi = atan(1.0) * 4.0;
    if (*n <= 1) {
	return 0;
    }
    ns2 = *n / 2;
    np1 = *n + 1;
    dt = pi / (fft_real_t) np1;
    i__1 = ns2;
    for (k = 1; k <= i__1; ++k) {
	wsave[k] = sin(k * dt) * 2.0;
/* L101: */
    }
    lnsv = np1 + (int) (log((fft_real_t) np1) / log(2.0)) + 4;
    rfft1i_(&np1, &wsave[ns2 + 1], &lnsv, &ier1);
    if (ier1 != 0) {
	*ier = 20;
	//xerfft_("SINT1I", &c_n5, (ftnlen)6);
    }

L300:
    return 0;
}